

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::PixelPackBufferStorageTestCase::execute
          (PixelPackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  undefined1 uVar5;
  GLenum GVar6;
  void *pvVar7;
  MessageBuilder *this_01;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  uint n_page;
  ulong uVar12;
  byte *value;
  undefined1 auStack_1b0 [384];
  
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x88eb,this->m_sparse_bo);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc16);
  (*this->m_gl->bufferPageCommitmentARB)(0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc29);
  (*this->m_gl->useProgram)(this->m_po);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc50);
  uVar12 = 0;
  (*this->m_gl->drawArrays)(5,0,4);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glDrawArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc53);
  (*this->m_gl->readPixels)
            (0,0,this->m_color_rb_width,this->m_color_rb_height,0x1908,0x1401,(void *)0x0);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glReadPixels() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc59);
  (*this->m_gl->copyBufferSubData)(0x88eb,0x8f36,0,0,(ulong)this->m_ref_data_size);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glCopyBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc5e);
  pvVar7 = (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_ref_data_size,1);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glMapBufferRange() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc63);
  pbVar11 = this->m_ref_data_ptr;
  bVar3 = true;
  while ((uVar12 < this->m_color_rb_height && (bVar3))) {
    uVar9 = 0;
    while ((uVar9 < this->m_color_rb_width && (bVar3))) {
      uVar10 = 0;
      while ((value = pbVar11 + uVar10, uVar10 < 4 && (bVar3))) {
        bVar1 = *value;
        iVar8 = (uint)bVar1 - (uint)*(byte *)((long)pvVar7 + uVar10);
        bVar2 = (byte)iVar8;
        bVar4 = -bVar2;
        if (0 < iVar8) {
          bVar4 = bVar2;
        }
        if (1 < bVar4) {
          auStack_1b0._0_8_ = this->m_testCtx->m_log;
          this_00 = (ostringstream *)(auStack_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Invalid texel data (channel:");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,") found at X:");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,", Y:");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,"). Expected value:");
          std::operator<<((ostream *)this_00,bVar1);
          std::operator<<((ostream *)this_00,", found value:");
          this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)auStack_1b0,value);
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          bVar3 = false;
        }
        uVar10 = uVar10 + 1;
      }
      uVar9 = uVar9 + 1;
      pvVar7 = (void *)((long)pvVar7 + uVar10);
      pbVar11 = value;
    }
    uVar12 = uVar12 + 1;
  }
  (*this->m_gl->unmapBuffer)(0x8f36);
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc99);
  (*this->m_gl->bufferPageCommitmentARB)(0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
  GVar6 = (*this->m_gl->getError)();
  glu::checkError(GVar6,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xca1);
  uVar5 = (*(code *)&UNK_00ac516e)();
  return (bool)uVar5;
}

Assistant:

bool PixelPackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_PIXEL_PACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages that are going to hold the texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = 1 + m_ref_data_size / m_page_size;

			DE_ASSERT((m_ref_data_size % m_page_size) == 0);

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing - all pages already de-committed  */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Draw full screen quad to generate the black-to-white gradient */
		const unsigned char* read_data_ptr = NULL;

		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		/* Read a framebuffer pixel data */
		m_gl.readPixels(0,																	/* x */
						0,																	/* y */
						m_color_rb_width, m_color_rb_height, GL_RGBA, GL_UNSIGNED_BYTE, 0); /* pixels */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadPixels() call failed.");

		m_gl.copyBufferSubData(GL_PIXEL_PACK_BUFFER, GL_COPY_READ_BUFFER, 0, /* readOffset */
							   0,											 /* writeOffset */
							   m_ref_data_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		read_data_ptr = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															m_ref_data_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

		/* Verify the data */
		unsigned int		 n_current_tex_data_byte	  = 0;
		const unsigned char* read_data_traveller_ptr	  = (const unsigned char*)read_data_ptr;
		const unsigned char* reference_data_traveller_ptr = (const unsigned char*)m_ref_data_ptr;

		for (unsigned int y = 0; y < m_color_rb_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_color_rb_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					unsigned char expected_value		 = 0;
					bool		  is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *reference_data_traveller_ptr;
					}

					if (is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) > 1)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *reference_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					reference_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		read_data_ptr = DE_NULL;
		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}